

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<char,_10>::TPZManVector(TPZManVector<char,_10> *this,TPZManVector<char,_10> *copy)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_TPZVec<char>).fStore = (char *)0x0;
  (this->super_TPZVec<char>).fNElements = 0;
  (this->super_TPZVec<char>).fNAlloc = 0;
  (this->super_TPZVec<char>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01649050;
  uVar3 = (copy->super_TPZVec<char>).fNElements;
  if ((long)uVar3 < 0xb) {
    pcVar1 = this->fExtAlloc;
    uVar2 = 0;
  }
  else {
    pcVar1 = (char *)operator_new__(uVar3);
    uVar2 = uVar3;
  }
  (this->super_TPZVec<char>).fStore = pcVar1;
  (this->super_TPZVec<char>).fNElements = uVar3;
  (this->super_TPZVec<char>).fNAlloc = uVar2;
  uVar2 = 0;
  if ((long)uVar3 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (this->super_TPZVec<char>).fStore[uVar2] = (copy->super_TPZVec<char>).fStore[uVar2];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}